

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_any_object.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  undefined4 extraout_var;
  obj *poVar2;
  any a;
  any b;
  obj o;
  
  o.str = "test";
  type::any::any<obj>(&a,&o);
  iVar1 = (*(a._value)->_vptr_erasure[2])();
  b._value = (erasure *)CONCAT44(extraout_var,iVar1);
  poVar2 = type::any::as<obj>(&b);
  iVar1 = strcmp(poVar2->str,"test");
  if (b._value != (erasure *)0x0) {
    (*(b._value)->_vptr_erasure[1])();
  }
  if (a._value != (erasure *)0x0) {
    (*(a._value)->_vptr_erasure[1])();
  }
  return -(uint)(iVar1 != 0);
}

Assistant:

int main() {
  try {
    obj o("test");
    type::any a(o);
    type::any b(a);
    if(strcmp(b.as<obj>().str, "test") == 0) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}